

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

bool __thiscall GraphBuilder::matchForksAndJoins(GraphBuilder *this)

{
  JoinNode *this_00;
  undefined8 *puVar1;
  NodeType NVar2;
  ForkNode *forkNode;
  FunctionGraph *this_01;
  ExitNode *exitNode;
  _Hash_node_base *p_Var3;
  bool bVar4;
  undefined8 *puVar5;
  ForkJoinAnalysis FJA;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> functions;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> llvmforks;
  undefined8 *local_60;
  undefined8 *local_58;
  long local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  
  p_Var3 = (this->llvmToJoins_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      this_00 = (JoinNode *)p_Var3[2]._M_nxt;
      dg::ForkJoinAnalysis::matchJoin((Value *)&local_48);
      puVar1 = local_40;
      for (puVar5 = local_48; puVar5 != puVar1; puVar5 = puVar5 + 1) {
        forkNode = (ForkNode *)findInstruction(this,(Instruction *)*puVar5);
        if ((forkNode == (ForkNode *)0x0) ||
           (NVar2 = Node::getType((Node *)forkNode), NVar2 != FORK)) {
          forkNode = (ForkNode *)0x0;
        }
        if (forkNode != (ForkNode *)0x0) {
          JoinNode::addCorrespondingFork(this_00,forkNode);
          bVar4 = true;
        }
      }
      dg::ForkJoinAnalysis::joinFunctions((Value *)&local_60);
      puVar1 = local_58;
      for (puVar5 = local_60; puVar5 != puVar1; puVar5 = puVar5 + 1) {
        this_01 = findFunction(this,(Function *)*puVar5);
        if (this_01 != (FunctionGraph *)0x0) {
          exitNode = FunctionGraph::exitNode(this_01);
          JoinNode::addJoinPredecessor(this_00,exitNode);
          bVar4 = true;
        }
      }
      if (local_60 != (undefined8 *)0x0) {
        operator_delete(local_60,local_50 - (long)local_60);
      }
      if (local_48 != (undefined8 *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar4;
}

Assistant:

bool GraphBuilder::matchForksAndJoins() {
    using namespace llvm;
    bool changed = false;

    ForkJoinAnalysis FJA{pointsToAnalysis_};

    for (auto &it : llvmToJoins_) {
        // it.first -> llvm::CallInst, it.second -> RWNode *
        auto *joinNode = it.second;
        auto llvmforks = FJA.matchJoin(it.first);
        for (const auto *forkcall : llvmforks) {
            auto *foundInstruction =
                    findInstruction(cast<Instruction>(forkcall));
            auto *forkNode = castNode<NodeType::FORK>(foundInstruction);
            if (forkNode) {
                changed |= true;
                joinNode->addCorrespondingFork(forkNode);
            }
        }

        auto functions = FJA.joinFunctions(it.first);
        for (const auto *llvmFunction : functions) {
            auto *functionGraph = findFunction(cast<Function>(llvmFunction));
            if (functionGraph) {
                joinNode->addJoinPredecessor(functionGraph->exitNode());
                changed |= true;
            }
        }
    }

    return changed;
}